

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O0

void __thiscall QTextEdit::resizeEvent(QTextEdit *this,QResizeEvent *e)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  QTextEditPrivate *pQVar6;
  QResizeEvent *in_RSI;
  long in_FS_OFFSET;
  QTextDocument *doc;
  QTextEditPrivate *d;
  QVariant alignmentProperty;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint uVar7;
  undefined8 in_stack_ffffffffffffffd8;
  QTextEditPrivate *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = d_func((QTextEdit *)0x6d36ea);
  if (pQVar6->lineWrap == NoWrap) {
    QWidgetTextControl::document
              ((QWidgetTextControl *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    in_stack_ffffffffffffffd8 = &DAT_aaaaaaaaaaaaaaaa;
    in_stack_fffffffffffffff0 = (QTextEditPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    QTextDocument::documentLayout();
    QObject::property(&stack0xffffffffffffffd8);
    QTextDocument::pageSize();
    bVar2 = QSizeF::isNull((QSizeF *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    bVar3 = 0;
    if (!bVar2) {
      iVar4 = ::QVariant::userType((QVariant *)0x6d379c);
      bVar3 = 0;
      if (iVar4 == 1) {
        bVar3 = ::QVariant::toBool();
        bVar3 = bVar3 ^ 0xff;
      }
    }
    bVar2 = (bVar3 & 1) != 0;
    if (bVar2) {
      QTextEditPrivate::adjustScrollbars((QTextEditPrivate *)in_stack_ffffffffffffffd8);
    }
    uVar7 = (uint)bVar2;
    ::QVariant::~QVariant((QVariant *)&stack0xffffffffffffffd8);
    if (uVar7 != 0) goto LAB_006d384d;
  }
  if (pQVar6->lineWrap != FixedPixelWidth) {
    QResizeEvent::oldSize(in_RSI);
    iVar4 = QSize::width((QSize *)0x6d3817);
    QResizeEvent::size(in_RSI);
    iVar5 = QSize::width((QSize *)0x6d382d);
    if (iVar4 != iVar5) {
      QTextEditPrivate::relayoutDocument(in_stack_fffffffffffffff0);
      goto LAB_006d384d;
    }
  }
  QTextEditPrivate::adjustScrollbars((QTextEditPrivate *)in_stack_ffffffffffffffd8);
LAB_006d384d:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextEdit::resizeEvent(QResizeEvent *e)
{
    Q_D(QTextEdit);

    if (d->lineWrap == NoWrap) {
        QTextDocument *doc = d->control->document();
        QVariant alignmentProperty = doc->documentLayout()->property("contentHasAlignment");

        if (!doc->pageSize().isNull()
            && alignmentProperty.userType() == QMetaType::Bool
            && !alignmentProperty.toBool()) {

            d->adjustScrollbars();
            return;
        }
    }

    if (d->lineWrap != FixedPixelWidth
        && e->oldSize().width() != e->size().width())
        d->relayoutDocument();
    else
        d->adjustScrollbars();
}